

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O0

int BIO_write(BIO *b,void *data,int len)

{
  int ret;
  int inl_local;
  void *in_local;
  BIO *bio_local;
  
  if (((b == (BIO *)0x0) || (b->method == (BIO_METHOD *)0x0)) ||
     (b->method->bwrite == (_func_595 *)0x0)) {
    ERR_put_error(0x11,0,0x73,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                  ,0x79);
    bio_local._4_4_ = -2;
  }
  else if (*(int *)&b->cb_arg == 0) {
    ERR_put_error(0x11,0,0x72,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                  ,0x7d);
    bio_local._4_4_ = -2;
  }
  else if (len < 1) {
    bio_local._4_4_ = 0;
  }
  else {
    bio_local._4_4_ = (*b->method->bwrite)(b,(char *)data,len);
    if (0 < bio_local._4_4_) {
      b->prev_bio = (bio_st *)((long)&b->prev_bio->method + (long)bio_local._4_4_);
    }
  }
  return bio_local._4_4_;
}

Assistant:

int BIO_write(BIO *bio, const void *in, int inl) {
  if (bio == NULL || bio->method == NULL || bio->method->bwrite == NULL) {
    OPENSSL_PUT_ERROR(BIO, BIO_R_UNSUPPORTED_METHOD);
    return -2;
  }
  if (!bio->init) {
    OPENSSL_PUT_ERROR(BIO, BIO_R_UNINITIALIZED);
    return -2;
  }
  if (inl <= 0) {
    return 0;
  }
  int ret = bio->method->bwrite(bio, reinterpret_cast<const char *>(in), inl);
  if (ret > 0) {
    bio->num_write += ret;
  }
  return ret;
}